

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void __thiscall MdlOptions::MdlOptions(MdlOptions *this,int argc,char **argv)

{
  string *this_00;
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  basic_command_line_parser<char> *this_01;
  size_type sVar3;
  any *paVar4;
  ostream *poVar5;
  basic_parsed_options<char> bStack_2b8;
  clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option>_>
  e;
  string usage;
  positional_options_description p;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_140 [40];
  long local_118;
  options_description desc;
  
  this->_standalone = true;
  this_00 = &this->_display_driver;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this_00,"ncurses",(allocator<char> *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_input_file,"",(allocator<char> *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->_output_file,"",(allocator<char> *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&usage,"Usage: mdl [OPTIONS] <input-file>",(allocator<char> *)&e);
  boost::program_options::options_description::options_description
            (&desc,(string *)&usage,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  e.super_error_info_injector<boost::program_options::unknown_option>.super_unknown_option.
  super_error_with_no_option_name._0_8_ = boost::program_options::options_description::add_options()
  ;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&e,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"display-driver,d",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input-parser,p",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input-file,i",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output-file,o",(char *)ptVar2);
  boost::program_options::options_description_easy_init::operator()(pcVar1,"version");
  boost::program_options::positional_options_description::positional_options_description(&p);
  boost::program_options::positional_options_description::add((char *)&p,0x13a18f);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&e,argc,argv);
  this_01 = boost::program_options::basic_command_line_parser<char>::options
                      ((basic_command_line_parser<char> *)&e,&desc);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this_01);
  boost::program_options::basic_command_line_parser<char>::run(&bStack_2b8,this_01);
  boost::program_options::store((basic_parsed_options *)&bStack_2b8,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&bStack_2b8.options);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"help",(allocator<char> *)&bStack_2b8);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_140,(key_type *)&e);
  std::__cxx11::string::~string((string *)&e);
  if (sVar3 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"version",(allocator<char> *)&bStack_2b8);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_140,(key_type *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (sVar3 == 0) {
      if (local_118 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"input-file",(allocator<char> *)&bStack_2b8);
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_140,(key_type *)&e);
        std::__cxx11::string::~string((string *)&e);
        if (sVar3 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"input-file",(allocator<char> *)&bStack_2b8);
          paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
          boost::any_cast<std::__cxx11::string_const&>(paVar4);
          std::__cxx11::string::_M_assign((string *)&this->_input_file);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"display-driver",(allocator<char> *)&bStack_2b8);
          sVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::count(local_140,(key_type *)&e);
          std::__cxx11::string::~string((string *)&e);
          if (sVar3 == 0) {
            std::__cxx11::string::assign((char *)this_00);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"display-driver",(allocator<char> *)&bStack_2b8);
            paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                                      ((string *)&vm);
            boost::any_cast<std::__cxx11::string_const&>(paVar4);
            std::__cxx11::string::_M_assign((string *)this_00);
            std::__cxx11::string::~string((string *)&e);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"output-file",(allocator<char> *)&bStack_2b8);
          sVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  ::count(local_140,(key_type *)&e);
          std::__cxx11::string::~string((string *)&e);
          if (sVar3 != 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"output-file",(allocator<char> *)&bStack_2b8);
            paVar4 = (any *)boost::program_options::abstract_variables_map::operator[]
                                      ((string *)&vm);
            boost::any_cast<std::__cxx11::string_const&>(paVar4);
            std::__cxx11::string::_M_assign((string *)&this->_output_file);
            std::__cxx11::string::~string((string *)&e);
          }
          boost::program_options::variables_map::~variables_map(&vm);
          boost::program_options::positional_options_description::~positional_options_description
                    (&p);
          boost::program_options::options_description::~options_description(&desc);
          std::__cxx11::string::~string((string *)&usage);
          return;
        }
      }
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&usage);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"mdl: Missing an input file");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"mdl (version: ");
      poVar5 = std::operator<<(poVar5,"1.1.3");
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  else {
    boost::program_options::operator<<((ostream *)&std::cout,&desc);
  }
  exit(0);
}

Assistant:

MdlOptions::MdlOptions(int argc, const char *const *argv) :
	_standalone(true),
	_display_driver("ncurses"),
	_input_file(""),
	_output_file("") {
	// Set Boost program options up
	const string usage("Usage: mdl [OPTIONS] <input-file>");
	po::options_description desc(usage);
	desc.add_options()
		("help,h", "produce help message and exit")
		("display-driver,d", po::value<string>(), "set display driver")
		("input-parser,p", po::value<string>(), "set input parser")
		("input-file,i", po::value<string>(), "input file to be used")
		("output-file,o", po::value<string>(), "output file")
		("version", "print the version information and exit");
	po::positional_options_description p;
	p.add("input-file", -1);
	po::variables_map vm;
	
	try {
		po::store(po::command_line_parser(argc, argv).options(desc).positional(p).run(), vm);
	} catch (boost::exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::program_options::unknown_option> > e) {
		cerr << "mdl: " << e.what() << endl;
		exit(1);
	}
	
	if (vm.count("help")) {
		cout << desc;
		exit(0);
	} else if (vm.count("version")) {
		cout << "mdl (version: " << MDL_VERSION_STRING << ")" << endl;
		exit(0);
	} else if (vm.empty() or vm.count("input-file") == 0) {
		cout << usage << endl;
		cout << "mdl: Missing an input file" << endl;
		exit(0);
	}

	_input_file = vm["input-file"].as<string>();
	
	if (vm.count("display-driver")) {
		_display_driver = vm["display-driver"].as<string>();
	} else {
		_display_driver = "ncurses";
	}

	if (vm.count("output-file")) {
		_output_file = vm["output-file"].as<string>();
	}
}